

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption_NamePart::SerializeWithCachedSizes
          (UninterpretedOption_NamePart *this,CodedOutputStream *output)

{
  bool bVar1;
  int size;
  char *data;
  string *value;
  UnknownFieldSet *pUVar2;
  CodedOutputStream *output_local;
  UninterpretedOption_NamePart *this_local;
  
  bVar1 = has_name_part(this);
  if (bVar1) {
    name_part_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    name_part_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(data,size,SERIALIZE);
    value = name_part_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(1,value,output);
  }
  bVar1 = has_is_extension(this);
  if (bVar1) {
    bVar1 = is_extension(this);
    internal::WireFormatLite::WriteBool(2,bVar1,output);
  }
  pUVar2 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar2,output);
  }
  return;
}

Assistant:

void UninterpretedOption_NamePart::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // required string name_part = 1;
  if (has_name_part()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name_part().data(), this->name_part().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->name_part(), output);
  }

  // required bool is_extension = 2;
  if (has_is_extension()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->is_extension(), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}